

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

void __thiscall slang::ast::MethodBuilder::MethodBuilder(MethodBuilder *this,MethodBuilder *other)

{
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *in_RSI;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *in_RDI;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *unaff_retaddr;
  
  (in_RDI->super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>).data_ = in_RSI->data_;
  (in_RDI->super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>).len = in_RSI->len;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x7019e8);
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::
  append_range<slang::SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>_>
            (unaff_retaddr,in_RDI);
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::clear(in_RSI);
  return;
}

Assistant:

MethodBuilder::MethodBuilder(MethodBuilder&& other) noexcept :
    compilation(other.compilation), symbol(other.symbol) {
    // Clear arguments in the other builder so that its destructor doesn't overwrite
    // any arguments we may add from here on out.
    args.append_range(other.args);
    other.args.clear();
}